

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void shunt_map_down_left(tgestate_t *state)

{
  uint8_t *puVar1;
  byte bVar2;
  
  (state->map_position).x = (state->map_position).x + '\x01';
  puVar1 = &(state->map_position).y;
  *puVar1 = *puVar1 + 0xff;
  get_supertiles(state);
  memmove(state->tile_buf + 0x18,state->tile_buf + 1,0x17f);
  memmove(state->window_buf + 0xc0,state->window_buf + 1,0xbff);
  plot_horizontal_tiles_common
            (state,state->tile_buf,state->map_buf,(state->map_position).y,state->window_buf);
  bVar2 = (state->map_position).x;
  plot_vertical_tiles_common
            (state,state->tile_buf + 0x17,state->map_buf + (6 - (ulong)((bVar2 & 3) == 0)),bVar2 - 1
             ,state->window_buf + 0x17);
  return;
}

Assistant:

void shunt_map_down_left(tgestate_t *state)
{
  assert(state != NULL);

  state->map_position.x++;
  state->map_position.y--;

  get_supertiles(state);

  memmove(&state->tile_buf[24], &state->tile_buf[1], TILE_BUF_LENGTH - 24 - 1);
  memmove(&state->window_buf[24 * 8], &state->window_buf[1], WINDOW_BUF_LENGTH - 24 * 8 - 1);

  plot_topmost_tiles(state);
  plot_rightmost_tiles(state);
}